

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_map.h
# Opt level: O0

void __thiscall
lemon::
VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>::
erase(VectorMap<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node,_bool>
      *this,vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>
            *keys)

{
  size_type sVar1;
  Notifier *item;
  vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_> *in_RSI;
  ObserverBase *in_RDI;
  int i;
  AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
  *this_00;
  reference in_stack_ffffffffffffffd8;
  int local_14;
  
  local_14 = 0;
  while( true ) {
    sVar1 = std::
            vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
            size(in_RSI);
    if ((int)sVar1 <= local_14) break;
    this_00 = (AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
               *)(in_RDI + 1);
    item = AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
           ::ObserverBase::notifier(in_RDI);
    std::vector<lemon::SmartDigraphBase::Node,_std::allocator<lemon::SmartDigraphBase::Node>_>::
    operator[](in_RSI,(long)local_14);
    AlterationNotifier<lemon::DigraphExtender<lemon::SmartDigraphBase>,_lemon::SmartDigraphBase::Node>
    ::id(this_00,(Item *)item);
    in_stack_ffffffffffffffd8 =
         std::vector<bool,_std::allocator<bool>_>::operator[]
                   ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffd8._M_mask,
                    (size_type)in_stack_ffffffffffffffd8._M_p);
    std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffd8,false);
    local_14 = local_14 + 1;
  }
  return;
}

Assistant:

virtual void erase(const std::vector<Key>& keys) {
    for (int i = 0; i < int(keys.size()); ++i) {
      container[Parent::notifier()->id(keys[i])] = Value();
    }
  }